

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGXMLScanner.cpp
# Opt level: O1

void __thiscall xercesc_4_0::SGXMLScanner::scanCDSection(SGXMLScanner *this)

{
  ReaderMgr *this_00;
  XMLBufferMgr *this_01;
  ReaderMgr *this_02;
  SchemaValidator *this_03;
  DatatypeValidator *dV;
  XMLDocumentHandler *pXVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  XMLCh XVar5;
  uint toFormat;
  XMLBuffer *this_04;
  ComplexTypeInfo **ppCVar6;
  ComplexTypeInfo *pCVar7;
  StackElem *pSVar8;
  UnexpectedEOFException *this_05;
  bool bVar9;
  Codes toEmit;
  XMLSize_t XVar10;
  XMLCh *value;
  XMLBufBid bbCData;
  XMLCh tmpBuf [9];
  XMLCh local_48 [12];
  
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  bVar3 = ReaderMgr::skippedChar(this_00,L'[');
  if (!bVar3) {
    XMLScanner::emitError(&this->super_XMLScanner,ExpectedOpenSquareBracket);
    ReaderMgr::skipPastSpaces(this_00);
    bVar3 = ReaderMgr::skippedChar(this_00,L'[');
    if (!bVar3) {
      return;
    }
  }
  this_01 = &(this->super_XMLScanner).fBufMgr;
  this_04 = XMLBufferMgr::bidOnBuffer(this_01);
  this_02 = (this->super_XMLScanner).fValidator[4].fReaderMgr;
  if (this_02->fCurReader == (XMLReader *)0x0) {
    pCVar7 = (ComplexTypeInfo *)0x0;
  }
  else {
    ppCVar6 = ValueStackOf<xercesc_4_0::ComplexTypeInfo_*>::peek
                        ((ValueStackOf<xercesc_4_0::ComplexTypeInfo_*> *)this_02);
    pCVar7 = *ppCVar6;
  }
  if (pCVar7 == (ComplexTypeInfo *)0x0) {
    cVar2 = '\x02';
  }
  else {
    cVar2 = '\x01';
    if ((pCVar7->fContentType & 0xfffffffdU) != 4) {
      cVar2 = (pCVar7->fContentType != 0U) * '\x02';
    }
  }
  pSVar8 = ElemStack::topElement(&(this->super_XMLScanner).fElemStack);
  bVar3 = false;
  bVar9 = false;
  do {
    XVar5 = ReaderMgr::getNextChar(this_00);
    toFormat = (uint)(ushort)XVar5;
    if (XVar5 == L'\0') {
      XMLScanner::emitError(&this->super_XMLScanner,UnterminatedCDATASection);
      this_05 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
      UnexpectedEOFException::UnexpectedEOFException
                (this_05,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/SGXMLScanner.cpp"
                 ,0x109a,Gen_UnexpectedEOF,(this->super_XMLScanner).fMemoryManager);
      __cxa_throw(this_05,&UnexpectedEOFException::typeinfo,XMLException::~XMLException);
    }
    if (((((this->super_XMLScanner).fValidate == true) &&
         ((this->super_XMLScanner).fStandalone == true)) &&
        ((char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable[toFormat] < '\0'))
       && ((cVar2 == '\x01' && (pSVar8->fThisElement->fExternalElement != false)))) {
      XMLValidator::emitError((this->super_XMLScanner).fValidator,NoWSForStandalone);
    }
    if ((XVar5 == L']') &&
       (bVar4 = XMLReader::skippedString((this->super_XMLScanner).fReaderMgr.fCurReader,L"]>"),
       bVar4)) {
      if (bVar3) {
        XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
      }
      XVar10 = this_04->fIndex;
      value = this_04->fBuffer;
      value[XVar10] = L'\0';
      if ((this->super_XMLScanner).fValidate == true) {
        this_03 = (SchemaValidator *)(this->super_XMLScanner).fValidator;
        dV = this_03->fCurrentDatatypeValidator;
        if ((dV != (DatatypeValidator *)0x0) && (dV->fWhiteSpace != 0)) {
          SchemaValidator::normalizeWhiteSpace
                    (this_03,dV,value,&(this->super_XMLScanner).fWSNormalizeBuf,false);
          XVar10 = (this->super_XMLScanner).fWSNormalizeBuf.fIndex;
          value = (this->super_XMLScanner).fWSNormalizeBuf.fBuffer;
          value[XVar10] = L'\0';
        }
        XMLBuffer::append((XMLBuffer *)&(this->super_XMLScanner).fValidator[2].fErrorReporter,value)
        ;
        if (cVar2 != '\x02') {
          XMLValidator::emitError((this->super_XMLScanner).fValidator,NoCharDataInCM);
        }
      }
      if (((((this->super_XMLScanner).fValidate == true) &&
           ((this->super_XMLScanner).fIdentityConstraintChecking == true)) &&
          (this->fICHandler != (IdentityConstraintHandler *)0x0)) &&
         (this->fICHandler->fMatcherStack->fMatchersCount != 0)) {
        XMLBuffer::append(&this->fContent,value,XVar10);
      }
      pXVar1 = (this->super_XMLScanner).fDocHandler;
      if (pXVar1 != (XMLDocumentHandler *)0x0) {
        if ((this->super_XMLScanner).fNormalizeData == false) {
          XVar10 = this_04->fIndex;
          value = this_04->fBuffer;
          value[XVar10] = L'\0';
        }
        (*pXVar1->_vptr_XMLDocumentHandler[2])(pXVar1,value,XVar10,1);
      }
      bVar4 = false;
    }
    else {
      if (!bVar9) {
        if ((toFormat & 0xfc00) == 0xdc00) {
          toEmit = Unexpected2ndSurrogateChar;
          if (!bVar3) {
LAB_002bd495:
            XMLScanner::emitError(&this->super_XMLScanner,toEmit);
          }
        }
        else {
          if ((toFormat & 0xfc00) == 0xd800) {
            if (bVar3) {
              XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
            }
            else {
              bVar3 = true;
            }
            goto LAB_002bd4f8;
          }
          toEmit = Expected2ndSurrogateChar;
          if (bVar3) goto LAB_002bd495;
          if ((((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable[toFormat] & 0x40)
              == 0) {
            XMLString::binToText(toFormat,local_48,8,0x10,(this->super_XMLScanner).fMemoryManager);
            XMLScanner::emitError
                      (&this->super_XMLScanner,InvalidCharacter,local_48,(XMLCh *)0x0,(XMLCh *)0x0,
                       (XMLCh *)0x0);
            bVar9 = true;
          }
        }
        bVar3 = false;
      }
LAB_002bd4f8:
      if (this_04->fIndex == this_04->fCapacity) {
        XMLBuffer::ensureCapacity(this_04,1);
      }
      XVar10 = this_04->fIndex;
      this_04->fIndex = XVar10 + 1;
      this_04->fBuffer[XVar10] = XVar5;
      bVar4 = true;
    }
    if (!bVar4) {
      XMLBufferMgr::releaseBuffer(this_01,this_04);
      return;
    }
  } while( true );
}

Assistant:

void SGXMLScanner::scanCDSection()
{
    static const XMLCh CDataClose[] =
    {
            chCloseSquare, chCloseAngle, chNull
    };

    //  The next character should be the opening square bracket. If not
    //  issue an error, but then try to recover by skipping any whitespace
    //  and checking again.
    if (!fReaderMgr.skippedChar(chOpenSquare))
    {
        emitError(XMLErrs::ExpectedOpenSquareBracket);
        fReaderMgr.skipPastSpaces();

        // If we still don't find it, then give up, else keep going
        if (!fReaderMgr.skippedChar(chOpenSquare))
            return;
    }

    // Get a buffer for this
    XMLBufBid bbCData(&fBufMgr);

    //  We just scan forward until we hit the end of CDATA section sequence.
    //  CDATA is effectively a big escape mechanism so we don't treat markup
    //  characters specially here.
    bool            emittedError = false;
    bool    gotLeadingSurrogate = false;

    // Get the character data opts for the current element
    XMLElementDecl::CharDataOpts charOpts = XMLElementDecl::AllCharData;
    // And see if the current element is a 'Children' style content model
    ComplexTypeInfo *currType = ((SchemaValidator*)fValidator)->getCurrentTypeInfo();
    if(currType)
    {
        SchemaElementDecl::ModelTypes modelType = (SchemaElementDecl::ModelTypes) currType->getContentType();
        if(modelType == SchemaElementDecl::Children ||
           modelType == SchemaElementDecl::ElementOnlyEmpty)
            charOpts = XMLElementDecl::SpacesOk;
        else if(modelType == SchemaElementDecl::Empty)
            charOpts = XMLElementDecl::NoCharData;
    }

    // should not be necessary when PSVI on element decl removed
    const ElemStack::StackElem* topElem = fElemStack.topElement();

    while (true)
    {
        const XMLCh nextCh = fReaderMgr.getNextChar();

        // Watch for unexpected end of file
        if (!nextCh)
        {
            emitError(XMLErrs::UnterminatedCDATASection);
            ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);
        }

        if (fValidate && fStandalone && (fReaderMgr.getCurrentReader()->isWhitespace(nextCh)))
        {
            // This document is standalone; this ignorable CDATA whitespace is forbidden.
            // XML 1.0, Section 2.9
            // And see if the current element is a 'Children' style content model
            if (topElem->fThisElement->isExternal()) {

                if (charOpts == XMLElementDecl::SpacesOk) // Element Content
                {
                    // Error - standalone should have a value of "no" as whitespace detected in an
                    // element type with element content whose element declaration was external
                    fValidator->emitError(XMLValid::NoWSForStandalone);
                    if (getPSVIHandler())
                    {
                        // REVISIT:
                        // PSVIElement->setValidity(PSVIItem::VALIDITY_INVALID);
                    }
                }
            }
        }

        //  If this is a close square bracket it could be our closing
        //  sequence.
        if (nextCh == chCloseSquare && fReaderMgr.skippedString(CDataClose))
        {
            //  make sure we were not expecting a trailing surrogate.
            if (gotLeadingSurrogate) {
                emitError(XMLErrs::Expected2ndSurrogateChar);
            }

            XMLSize_t xsLen = bbCData.getLen();
            const XMLCh* xsNormalized = bbCData.getRawBuffer();
            if (fValidate) {

                DatatypeValidator* tempDV = ((SchemaValidator*) fValidator)->getCurrentDatatypeValidator();
                if (tempDV && tempDV->getWSFacet() != DatatypeValidator::PRESERVE)
                {
                    // normalize the character according to schema whitespace facet
                    ((SchemaValidator*) fValidator)->normalizeWhiteSpace(tempDV, xsNormalized, fWSNormalizeBuf);
                    xsNormalized = fWSNormalizeBuf.getRawBuffer();
                    xsLen = fWSNormalizeBuf.getLen();
                }

                // tell the schema validation about the character data for checkContent later
                ((SchemaValidator*)fValidator)->setDatatypeBuffer(xsNormalized);

                if (charOpts != XMLElementDecl::AllCharData)
                {
                    // They definitely cannot handle any type of char data
                    fValidator->emitError(XMLValid::NoCharDataInCM);
                    if (getPSVIHandler())
                    {
                        // REVISIT:
                        // PSVIElement->setValidity(PSVIItem::VALIDITY_INVALID);
                    }
                }
            }

            // call all active identity constraints
            if (toCheckIdentityConstraint() && fICHandler->getMatcherCount()) {
                fContent.append(xsNormalized, xsLen);
            }

            // If we have a doc handler, call it
            if (fDocHandler)
            {
                if (fNormalizeData) {
                    fDocHandler->docCharacters(xsNormalized, xsLen, true);
                }
                else {
                    fDocHandler->docCharacters(
                        bbCData.getRawBuffer(), bbCData.getLen(), true
                    );
                }
            }

            // And we are done
            break;
        }

        //  Make sure its a valid character. But if we've emitted an error
        //  already, don't bother with the overhead since we've already told
        //  them about it.
        if (!emittedError)
        {
            // Deal with surrogate pairs
            if ((nextCh >= 0xD800) && (nextCh <= 0xDBFF))
            {
                //  Its a leading surrogate. If we already got one, then
                //  issue an error, else set leading flag to make sure that
                //  we look for a trailing next time.
                if (gotLeadingSurrogate)
                    emitError(XMLErrs::Expected2ndSurrogateChar);
                else
                    gotLeadingSurrogate = true;
            }
            else
            {
                //  If its a trailing surrogate, make sure that we are
                //  prepared for that. Else, its just a regular char so make
                //  sure that we were not expected a trailing surrogate.
                if ((nextCh >= 0xDC00) && (nextCh <= 0xDFFF))
                {
                    // Its trailing, so make sure we were expecting it
                    if (!gotLeadingSurrogate)
                        emitError(XMLErrs::Unexpected2ndSurrogateChar);
                }
                else
                {
                    //  Its just a char, so make sure we were not expecting a
                    //  trailing surrogate.
                    if (gotLeadingSurrogate)
                        emitError(XMLErrs::Expected2ndSurrogateChar);

                    // Its got to at least be a valid XML character
                    else if (!fReaderMgr.getCurrentReader()->isXMLChar(nextCh))
                    {
                        XMLCh tmpBuf[9];
                        XMLString::binToText
                        (
                            nextCh
                            , tmpBuf
                            , 8
                            , 16
                            , fMemoryManager
                        );
                        emitError(XMLErrs::InvalidCharacter, tmpBuf);
                        emittedError = true;
                    }
                }
                gotLeadingSurrogate = false;
            }
        }

        // Add it to the buffer
        bbCData.append(nextCh);
    }
}